

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmocka.c
# Opt level: O2

int value_in_set_display_error(unsigned_long value,CheckIntegerSet *check_integer_set,int invert)

{
  unsigned_long *puVar1;
  unsigned_long *puVar2;
  size_t sVar3;
  char *pcVar4;
  int iVar5;
  size_t sVar6;
  
  _assert_true((unsigned_long)check_integer_set,"check_integer_set",
               "/workspace/llm4binary/github/license_c_cmakelists/RoaringBitmap[P]CRoaring/build_O2/_deps/cmocka-src/src/cmocka.c"
               ,0x4c5);
  puVar2 = check_integer_set->set;
  sVar3 = check_integer_set->size_of_set;
  sVar6 = 0;
  do {
    if (sVar3 == sVar6) {
      if (invert != 0) goto LAB_0010fe98;
      goto LAB_0010fe4d;
    }
    puVar1 = puVar2 + sVar6;
    sVar6 = sVar6 + 1;
  } while (*puVar1 != value);
  if (invert == 0) {
LAB_0010fe98:
    iVar5 = 1;
  }
  else {
LAB_0010fe4d:
    pcVar4 = "";
    if (invert == 0) {
      pcVar4 = "not ";
    }
    cm_print_error("%lu is %sin the set (",value,pcVar4);
    for (sVar6 = 0; sVar3 != sVar6; sVar6 = sVar6 + 1) {
      cm_print_error("%#lx, ",puVar2[sVar6]);
    }
    iVar5 = 0;
    cm_print_error(")\n");
  }
  return iVar5;
}

Assistant:

static int value_in_set_display_error(
        const LargestIntegralType value,
        const CheckIntegerSet * const check_integer_set, const int invert) {
    int succeeded = invert;
    assert_non_null(check_integer_set);
    {
        const LargestIntegralType * const set = check_integer_set->set;
        const size_t size_of_set = check_integer_set->size_of_set;
        size_t i;
        for (i = 0; i < size_of_set; i++) {
            if (set[i] == value) {
                /* If invert = 0 and item is found, succeeded = 1. */
                /* If invert = 1 and item is found, succeeded = 0. */
                succeeded = !succeeded;
                break;
            }
        }
        if (succeeded) {
            return 1;
        }
        cm_print_error(LargestIntegralTypePrintfFormatDecimal
                       " is %sin the set (",
                       value, invert ? "" : "not ");
        for (i = 0; i < size_of_set; i++) {
            cm_print_error(LargestIntegralTypePrintfFormat ", ", set[i]);
        }
        cm_print_error(")\n");
    }
    return 0;
}